

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmListCommand.cxx
# Opt level: O2

bool __thiscall
cmListCommand::HandleSortCommand
          (cmListCommand *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *args)

{
  ulong uVar1;
  pointer pbVar2;
  _Iter_comp_iter<cmStringSorter> __comp;
  bool bVar3;
  bool bVar4;
  ulong uVar5;
  code *pcVar6;
  code *pcVar7;
  bool bVar8;
  uint local_150;
  uint local_14c;
  uint local_13c;
  string value;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_118;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  varArgsExpanded;
  string error_1;
  string messageHint;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  uVar5 = (long)(args->
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                )._M_impl.super__Vector_impl_data._M_finish -
          (long)(args->
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                )._M_impl.super__Vector_impl_data._M_start >> 5;
  if (uVar5 < 2) {
    __assert_fail("args.size() >= 2",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/micst[P]CMake/Source/cmListCommand.cxx"
                  ,0x495,"bool cmListCommand::HandleSortCommand(const std::vector<std::string> &)");
  }
  if (uVar5 < 9) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&messageHint,"sub-command SORT ",(allocator<char> *)&value);
    uVar5 = 2;
    local_150 = 0;
    local_14c = 0;
    local_13c = 0;
    do {
      pbVar2 = (args->
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               )._M_impl.super__Vector_impl_data._M_start;
      bVar8 = (ulong)((long)(args->
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            )._M_impl.super__Vector_impl_data._M_finish - (long)pbVar2 >> 5) <=
              uVar5;
      if (bVar8) {
        varArgsExpanded.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
        varArgsExpanded.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
        varArgsExpanded.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        bVar3 = GetList(this,&varArgsExpanded,pbVar2 + 1);
        if (bVar3) {
          if (local_150 < 2 && (local_14c < 2 && local_13c < 2)) {
            std::
            __sort<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,__gnu_cxx::__ops::_Iter_less_iter>
                      (varArgsExpanded.
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start,
                       varArgsExpanded.
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_finish);
          }
          else {
            pcVar6 = (StringFilter)0x0;
            pcVar7 = (StringFilter)0x0;
            if (local_13c == 2) {
              pcVar7 = cmsys::SystemTools::GetFilenameName;
            }
            if (local_14c == 2) {
              pcVar6 = cmsys::SystemTools::LowerCase;
            }
            value.field_2._M_local_buf[0] = local_150 == 2;
            __comp._M_comp._17_7_ = value.field_2._M_allocated_capacity._1_7_;
            __comp._M_comp.descending = (bool)value.field_2._M_local_buf[0];
            __comp._M_comp.filters[1] = pcVar6;
            __comp._M_comp.filters[0] = pcVar7;
            value._M_dataplus._M_p = (pointer)pcVar7;
            value._M_string_length = (size_type)pcVar6;
            std::
            __sort<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,__gnu_cxx::__ops::_Iter_comp_iter<cmStringSorter>>
                      ((__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                        )varArgsExpanded.
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start,
                       (__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                        )varArgsExpanded.
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_finish,__comp);
          }
          cmJoin<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
                    (&value,&varArgsExpanded,";");
          cmMakefile::AddDefinition
                    ((this->super_cmCommand).Makefile,pbVar2 + 1,value._M_dataplus._M_p);
          std::__cxx11::string::~string((string *)&value);
        }
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector(&varArgsExpanded);
        break;
      }
      std::__cxx11::string::string((string *)&value,(string *)(pbVar2 + uVar5));
      uVar1 = uVar5 + 1;
      bVar3 = std::operator==(&value,"COMPARE");
      if (bVar3) {
        if (local_13c != 0) {
          std::operator+(&local_118,&messageHint,"option \"");
          std::operator+(&error_1,&local_118,&value);
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         &varArgsExpanded,&error_1,"\" has been specified multiple times.");
          std::__cxx11::string::~string((string *)&error_1);
          std::__cxx11::string::~string((string *)&local_118);
          cmCommand::SetError(&this->super_cmCommand,
                              (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              &varArgsExpanded);
          goto LAB_00268cd8;
        }
        pbVar2 = (args->
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 )._M_impl.super__Vector_impl_data._M_start;
        if ((ulong)((long)(args->
                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          )._M_impl.super__Vector_impl_data._M_finish - (long)pbVar2 >> 5) <= uVar1)
        {
          std::operator+(&local_118,&messageHint,"missing argument for option \"");
          std::operator+(&error_1,&local_118,&value);
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         &varArgsExpanded,&error_1,"\".");
          std::__cxx11::string::~string((string *)&error_1);
          std::__cxx11::string::~string((string *)&local_118);
          cmCommand::SetError(&this->super_cmCommand,
                              (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              &varArgsExpanded);
          std::__cxx11::string::~string((string *)&varArgsExpanded);
          local_13c = 0;
          goto LAB_00268ce3;
        }
        std::__cxx11::string::string((string *)&varArgsExpanded,(string *)(pbVar2 + uVar1));
        bVar4 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )&varArgsExpanded,"STRING");
        bVar3 = true;
        if (bVar4) {
          local_13c = 1;
        }
        else {
          bVar4 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)&varArgsExpanded,"FILE_BASENAME");
          local_13c = 2;
          if (!bVar4) {
            std::operator+(&local_90,&messageHint,"value \"");
            std::operator+(&local_70,&local_90,
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           &varArgsExpanded);
            std::operator+(&local_50,&local_70,"\" for option \"");
            std::operator+(&local_118,&local_50,&value);
            std::operator+(&error_1,&local_118,"\" is invalid.");
            std::__cxx11::string::~string((string *)&local_118);
            std::__cxx11::string::~string((string *)&local_50);
            std::__cxx11::string::~string((string *)&local_70);
            std::__cxx11::string::~string((string *)&local_90);
            cmCommand::SetError(&this->super_cmCommand,&error_1);
            std::__cxx11::string::~string((string *)&error_1);
            local_13c = 0;
LAB_002691da:
            bVar3 = false;
          }
        }
LAB_002691df:
        uVar5 = uVar5 + 2;
        std::__cxx11::string::~string((string *)&varArgsExpanded);
      }
      else {
        bVar3 = std::operator==(&value,"CASE");
        if (bVar3) {
          if (local_14c != 0) {
            std::operator+(&local_118,&messageHint,"option \"");
            std::operator+(&error_1,&local_118,&value);
            std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           &varArgsExpanded,&error_1,"\" has been specified multiple times.");
            std::__cxx11::string::~string((string *)&error_1);
            std::__cxx11::string::~string((string *)&local_118);
            cmCommand::SetError(&this->super_cmCommand,
                                (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )&varArgsExpanded);
            goto LAB_00268cd8;
          }
          pbVar2 = (args->
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   )._M_impl.super__Vector_impl_data._M_start;
          if (uVar1 < (ulong)((long)(args->
                                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                    )._M_impl.super__Vector_impl_data._M_finish - (long)pbVar2 >> 5)
             ) {
            std::__cxx11::string::string((string *)&varArgsExpanded,(string *)(pbVar2 + uVar1));
            bVar4 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                     *)&varArgsExpanded,"SENSITIVE");
            bVar3 = true;
            if (bVar4) {
              local_14c = 1;
            }
            else {
              bVar4 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                       *)&varArgsExpanded,"INSENSITIVE");
              local_14c = 2;
              if (!bVar4) {
                std::operator+(&local_90,&messageHint,"value \"");
                std::operator+(&local_70,&local_90,
                               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               &varArgsExpanded);
                std::operator+(&local_50,&local_70,"\" for option \"");
                std::operator+(&local_118,&local_50,&value);
                std::operator+(&error_1,&local_118,"\" is invalid.");
                std::__cxx11::string::~string((string *)&local_118);
                std::__cxx11::string::~string((string *)&local_50);
                std::__cxx11::string::~string((string *)&local_70);
                std::__cxx11::string::~string((string *)&local_90);
                cmCommand::SetError(&this->super_cmCommand,&error_1);
                std::__cxx11::string::~string((string *)&error_1);
                local_14c = 0;
                goto LAB_002691da;
              }
            }
            goto LAB_002691df;
          }
          std::operator+(&local_118,&messageHint,"missing argument for option \"");
          std::operator+(&error_1,&local_118,&value);
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         &varArgsExpanded,&error_1,"\".");
          std::__cxx11::string::~string((string *)&error_1);
          std::__cxx11::string::~string((string *)&local_118);
          cmCommand::SetError(&this->super_cmCommand,
                              (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              &varArgsExpanded);
          std::__cxx11::string::~string((string *)&varArgsExpanded);
          local_14c = 0;
        }
        else {
          bVar3 = std::operator==(&value,"ORDER");
          if (bVar3) {
            if (local_150 == 0) {
              pbVar2 = (args->
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       )._M_impl.super__Vector_impl_data._M_start;
              if (uVar1 < (ulong)((long)(args->
                                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                        )._M_impl.super__Vector_impl_data._M_finish - (long)pbVar2
                                 >> 5)) {
                std::__cxx11::string::string((string *)&varArgsExpanded,(string *)(pbVar2 + uVar1));
                bVar4 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                         *)&varArgsExpanded,"ASCENDING");
                bVar3 = true;
                if (bVar4) {
                  local_150 = 1;
                }
                else {
                  bVar4 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                           *)&varArgsExpanded,"DESCENDING");
                  local_150 = 2;
                  if (!bVar4) {
                    std::operator+(&local_90,&messageHint,"value \"");
                    std::operator+(&local_70,&local_90,
                                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                    *)&varArgsExpanded);
                    std::operator+(&local_50,&local_70,"\" for option \"");
                    std::operator+(&local_118,&local_50,&value);
                    std::operator+(&error_1,&local_118,"\" is invalid.");
                    std::__cxx11::string::~string((string *)&local_118);
                    std::__cxx11::string::~string((string *)&local_50);
                    std::__cxx11::string::~string((string *)&local_70);
                    std::__cxx11::string::~string((string *)&local_90);
                    cmCommand::SetError(&this->super_cmCommand,&error_1);
                    std::__cxx11::string::~string((string *)&error_1);
                    local_150 = 0;
                    goto LAB_002691da;
                  }
                }
                goto LAB_002691df;
              }
              std::operator+(&local_118,&messageHint,"missing argument for option \"");
              std::operator+(&error_1,&local_118,&value);
              std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             &varArgsExpanded,&error_1,"\".");
              std::__cxx11::string::~string((string *)&error_1);
              std::__cxx11::string::~string((string *)&local_118);
              cmCommand::SetError(&this->super_cmCommand,
                                  (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)&varArgsExpanded);
              std::__cxx11::string::~string((string *)&varArgsExpanded);
              local_150 = 0;
              goto LAB_00268ce3;
            }
            std::operator+(&local_118,&messageHint,"option \"");
            std::operator+(&error_1,&local_118,&value);
            std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           &varArgsExpanded,&error_1,"\" has been specified multiple times.");
            std::__cxx11::string::~string((string *)&error_1);
            std::__cxx11::string::~string((string *)&local_118);
            cmCommand::SetError(&this->super_cmCommand,
                                (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )&varArgsExpanded);
          }
          else {
            std::operator+(&local_118,&messageHint,"option \"");
            std::operator+(&error_1,&local_118,&value);
            std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           &varArgsExpanded,&error_1,"\" is unknown.");
            std::__cxx11::string::~string((string *)&error_1);
            std::__cxx11::string::~string((string *)&local_118);
            cmCommand::SetError(&this->super_cmCommand,
                                (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )&varArgsExpanded);
          }
LAB_00268cd8:
          std::__cxx11::string::~string((string *)&varArgsExpanded);
        }
LAB_00268ce3:
        bVar3 = false;
        uVar5 = uVar1;
      }
      std::__cxx11::string::~string((string *)&value);
    } while (bVar3);
    std::__cxx11::string::~string((string *)&messageHint);
  }
  else {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&messageHint,"sub-command SORT only takes up to six arguments.",
               (allocator<char> *)&value);
    cmCommand::SetError(&this->super_cmCommand,&messageHint);
    std::__cxx11::string::~string((string *)&messageHint);
    bVar8 = false;
  }
  return bVar8;
}

Assistant:

bool cmListCommand::HandleSortCommand(std::vector<std::string> const& args)
{
  assert(args.size() >= 2);
  if (args.size() > 8) {
    this->SetError("sub-command SORT only takes up to six arguments.");
    return false;
  }

  auto sortCompare = cmStringSorter::Compare::UNINITIALIZED;
  auto sortCaseSensitivity = cmStringSorter::CaseSensitivity::UNINITIALIZED;
  auto sortOrder = cmStringSorter::Order::UNINITIALIZED;

  size_t argumentIndex = 2;
  const std::string messageHint = "sub-command SORT ";

  while (argumentIndex < args.size()) {
    const std::string option = args[argumentIndex++];
    if (option == "COMPARE") {
      if (sortCompare != cmStringSorter::Compare::UNINITIALIZED) {
        std::string error = messageHint + "option \"" + option +
          "\" has been specified multiple times.";
        this->SetError(error);
        return false;
      }
      if (argumentIndex < args.size()) {
        const std::string argument = args[argumentIndex++];
        if (argument == "STRING") {
          sortCompare = cmStringSorter::Compare::STRING;
        } else if (argument == "FILE_BASENAME") {
          sortCompare = cmStringSorter::Compare::FILE_BASENAME;
        } else {
          std::string error = messageHint + "value \"" + argument +
            "\" for option \"" + option + "\" is invalid.";
          this->SetError(error);
          return false;
        }
      } else {
        std::string error =
          messageHint + "missing argument for option \"" + option + "\".";
        this->SetError(error);
        return false;
      }
    } else if (option == "CASE") {
      if (sortCaseSensitivity !=
          cmStringSorter::CaseSensitivity::UNINITIALIZED) {
        std::string error = messageHint + "option \"" + option +
          "\" has been specified multiple times.";
        this->SetError(error);
        return false;
      }
      if (argumentIndex < args.size()) {
        const std::string argument = args[argumentIndex++];
        if (argument == "SENSITIVE") {
          sortCaseSensitivity = cmStringSorter::CaseSensitivity::SENSITIVE;
        } else if (argument == "INSENSITIVE") {
          sortCaseSensitivity = cmStringSorter::CaseSensitivity::INSENSITIVE;
        } else {
          std::string error = messageHint + "value \"" + argument +
            "\" for option \"" + option + "\" is invalid.";
          this->SetError(error);
          return false;
        }
      } else {
        std::string error =
          messageHint + "missing argument for option \"" + option + "\".";
        this->SetError(error);
        return false;
      }
    } else if (option == "ORDER") {

      if (sortOrder != cmStringSorter::Order::UNINITIALIZED) {
        std::string error = messageHint + "option \"" + option +
          "\" has been specified multiple times.";
        this->SetError(error);
        return false;
      }
      if (argumentIndex < args.size()) {
        const std::string argument = args[argumentIndex++];
        if (argument == "ASCENDING") {
          sortOrder = cmStringSorter::Order::ASCENDING;
        } else if (argument == "DESCENDING") {
          sortOrder = cmStringSorter::Order::DESCENDING;
        } else {
          std::string error = messageHint + "value \"" + argument +
            "\" for option \"" + option + "\" is invalid.";
          this->SetError(error);
          return false;
        }
      } else {
        std::string error =
          messageHint + "missing argument for option \"" + option + "\".";
        this->SetError(error);
        return false;
      }
    } else {
      std::string error =
        messageHint + "option \"" + option + "\" is unknown.";
      this->SetError(error);
      return false;
    }
  }
  // set Default Values if Option is not given
  if (sortCompare == cmStringSorter::Compare::UNINITIALIZED) {
    sortCompare = cmStringSorter::Compare::STRING;
  }
  if (sortCaseSensitivity == cmStringSorter::CaseSensitivity::UNINITIALIZED) {
    sortCaseSensitivity = cmStringSorter::CaseSensitivity::SENSITIVE;
  }
  if (sortOrder == cmStringSorter::Order::UNINITIALIZED) {
    sortOrder = cmStringSorter::Order::ASCENDING;
  }

  const std::string& listName = args[1];
  // expand the variable
  std::vector<std::string> varArgsExpanded;
  if (!this->GetList(varArgsExpanded, listName)) {
    return true;
  }

  if ((sortCompare == cmStringSorter::Compare::STRING) &&
      (sortCaseSensitivity == cmStringSorter::CaseSensitivity::SENSITIVE) &&
      (sortOrder == cmStringSorter::Order::ASCENDING)) {
    std::sort(varArgsExpanded.begin(), varArgsExpanded.end());
  } else {
    cmStringSorter sorter(sortCompare, sortCaseSensitivity, sortOrder);
    std::sort(varArgsExpanded.begin(), varArgsExpanded.end(), sorter);
  }

  std::string value = cmJoin(varArgsExpanded, ";");
  this->Makefile->AddDefinition(listName, value.c_str());
  return true;
}